

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::TrendGroup> *
metaf::TrendGroup::fromTimeSpan(optional<metaf::TrendGroup> *__return_storage_ptr__,string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint value_1;
  ulong uVar8;
  ulong uVar9;
  char cVar10;
  uint value;
  smatch match;
  undefined2 local_88;
  undefined1 local_86;
  undefined2 local_84;
  undefined1 local_82;
  char local_80;
  string_type local_78;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  
  if ((fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_),
     iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_,
               "(\\d\\d\\d\\d)/(\\d\\d\\d\\d)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_);
  }
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin._M_current = (char *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (s->_M_dataplus)._M_p;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + s->_M_string_length),&local_58,
                     &fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_78,&local_58,1);
    if (local_78._M_string_length == 4) {
      uVar8 = 0;
      lVar5 = 0;
      uVar6 = 0;
      do {
        if ((byte)(local_78._M_dataplus._M_p[lVar5] - 0x3aU) < 0xf6) {
          bVar4 = 0;
          goto LAB_001a515b;
        }
        uVar6 = (uint)(byte)(local_78._M_dataplus._M_p[lVar5] - 0x30) + uVar6 * 10;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 2);
      bVar4 = 1;
      uVar8 = (ulong)uVar6;
LAB_001a515b:
      iVar3 = 0;
      lVar5 = 2;
      do {
        if (9 < (byte)(local_78._M_dataplus._M_p[lVar5] - 0x30U)) goto LAB_001a51b4;
        iVar3 = (uint)(byte)(local_78._M_dataplus._M_p[lVar5] - 0x30U) + iVar3 * 10;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 4);
      if (bVar4 == 0) goto LAB_001a51b4;
      uVar8 = uVar8 | (ulong)bVar4 << 0x20;
      local_80 = '\x01';
    }
    else {
LAB_001a51b4:
      local_80 = '\0';
      local_82 = 0;
      local_84 = 0;
      iVar3 = 0;
      uVar8 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_78,&local_58,2);
    if (local_78._M_string_length == 4) {
      iVar2 = 0;
      lVar5 = 0;
      iVar7 = 0;
      do {
        if ((byte)(local_78._M_dataplus._M_p[lVar5] - 0x3aU) < 0xf6) {
          cVar10 = '\0';
          goto LAB_001a523f;
        }
        iVar7 = (uint)(byte)(local_78._M_dataplus._M_p[lVar5] - 0x30) + iVar7 * 10;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 2);
      cVar10 = '\x01';
      iVar2 = iVar7;
LAB_001a523f:
      iVar7 = 0;
      lVar5 = 2;
      do {
        if (9 < (byte)(local_78._M_dataplus._M_p[lVar5] - 0x30U)) goto LAB_001a5299;
        iVar7 = (uint)(byte)(local_78._M_dataplus._M_p[lVar5] - 0x30U) + iVar7 * 10;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 4);
      if (cVar10 == '\0') goto LAB_001a5299;
      uVar9 = (ulong)CONCAT14(cVar10,iVar2);
      cVar10 = '\x01';
    }
    else {
LAB_001a5299:
      local_86 = 0;
      local_88 = 0;
      uVar9 = 0;
      iVar7 = 0;
      cVar10 = '\0';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((local_80 != '\0') && (cVar10 != '\0')) {
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1f) =
           local_82;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1d) =
           local_84;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x31) =
           local_88;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x33) =
           local_86;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::TrendGroup>._M_payload = 7;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.isTafTimeSpanGroup = true;
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload +
                0xc) = uVar8;
      *(int *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                      _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x14)
           = iVar3;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = 0;
      *(char *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)
                       ._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c
               ) = local_80;
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload +
                0x20) = uVar9;
      *(int *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                      _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28)
           = iVar7;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x2c) = 0;
      *(char *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)
                       ._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30
               ) = cVar10;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_engaged = true;
      goto LAB_001a5326;
    }
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x3c) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x38) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TrendGroup>._M_payload = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 8) = 0;
LAB_001a5326:
  if (local_58.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromTimeSpan(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("(\\d\\d\\d\\d)/(\\d\\d\\d\\d)");
	static const auto matchFrom = 1, matchTill = 2;
	std::smatch match;
	if (!regex_match(s, match, rgx)) return notRecognised;
	const auto from = MetafTime::fromStringDDHH(match.str(matchFrom));
	const auto till = MetafTime::fromStringDDHH(match.str(matchTill));
	if (!from.has_value() || !till.has_value()) return notRecognised;

	TrendGroup result;
	result.t = Type::TIME_SPAN;
	result.isTafTimeSpanGroup = true;
	result.tFrom = from;
	result.tTill = till;
	return result;
}